

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O0

RPCHelpMan * wallet::signmessage(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff6b8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  allocator<char> *in_stack_fffffffffffff6f8;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff700;
  RPCArgOptions *in_stack_fffffffffffff708;
  string *in_stack_fffffffffffff710;
  Fallback *in_stack_fffffffffffff718;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff720;
  string *in_stack_fffffffffffff728;
  RPCArg *in_stack_fffffffffffff730;
  RPCResults *in_stack_fffffffffffff738;
  RPCResult *in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff800;
  undefined8 in_stack_fffffffffffff808;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff810;
  pointer description;
  pointer name;
  pointer this_00;
  allocator<char> local_7c2;
  allocator<char> local_7c1 [32];
  allocator<char> local_7a1 [7];
  allocator<char> local_79a;
  allocator<char> local_799 [8];
  allocator<char> local_791 [32];
  allocator<char> local_771 [145];
  RPCMethodImpl *in_stack_fffffffffffff920;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::operator+(&in_stack_fffffffffffff708->skip_type_check,&in_stack_fffffffffffff700->m_names);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_799[1] = (allocator<char>)0x0;
  local_799[2] = (allocator<char>)0x0;
  local_799[3] = (allocator<char>)0x0;
  local_799[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6c8,(Optional *)in_stack_fffffffffffff6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::string(in_stack_fffffffffffff6d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6b8);
  RPCArg::RPCArg(in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                 (Type)((ulong)in_stack_fffffffffffff720 >> 0x20),in_stack_fffffffffffff718,
                 in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_7a1[1] = (allocator<char>)0x0;
  local_7a1[2] = (allocator<char>)0x0;
  local_7a1[3] = (allocator<char>)0x0;
  local_7a1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6c8,(Optional *)in_stack_fffffffffffff6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::string(in_stack_fffffffffffff6d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6b8);
  RPCArg::RPCArg(in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                 (Type)((ulong)in_stack_fffffffffffff720 >> 0x20),in_stack_fffffffffffff718,
                 in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff718 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff6b8);
  __l._M_len = (size_type)in_stack_fffffffffffff708;
  __l._M_array = in_stack_fffffffffffff700;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6f8,__l,
             (allocator_type *)in_stack_fffffffffffff6f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  description = (pointer)0x0;
  name = (pointer)0x0;
  this_00 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,(Type)((ulong)in_stack_fffffffffffff738 >> 0x20),
             &in_stack_fffffffffffff730->m_names,in_stack_fffffffffffff728,in_stack_fffffffffffff720
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff738,(RPCResult *)in_stack_fffffffffffff730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+((char *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  std::operator+(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleRpc(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff6b8,(string *)0x1812645);
  this = (RPCArg *)&stack0xfffffffffffff7f0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::signmessage()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_00,&name->m_names,&description->m_names,in_stack_fffffffffffff810,
             (RPCResults *)in_stack_fffffffffffff808,(RPCExamples *)in_stack_fffffffffffff800,
             in_stack_fffffffffffff920);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff810);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff811);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff812);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff813);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff814);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff815);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff816);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff817);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7c2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_7c1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_7a1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_79a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_799);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_791);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_771);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan signmessage()
{
    return RPCHelpMan{"signmessage",
        "\nSign a message with the private key of an address" +
          HELP_REQUIRING_PASSPHRASE,
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address to use for the private key."},
            {"message", RPCArg::Type::STR, RPCArg::Optional::NO, "The message to create a signature of."},
        },
        RPCResult{
            RPCResult::Type::STR, "signature", "The signature of the message encoded in base 64"
        },
        RPCExamples{
            "\nUnlock the wallet for 30 seconds\n"
            + HelpExampleCli("walletpassphrase", "\"mypassphrase\" 30") +
            "\nCreate the signature\n"
            + HelpExampleCli("signmessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\" \"my message\"") +
            "\nVerify the signature\n"
            + HelpExampleCli("verifymessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\" \"signature\" \"my message\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("signmessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\", \"my message\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
            if (!pwallet) return UniValue::VNULL;

            LOCK(pwallet->cs_wallet);

            EnsureWalletIsUnlocked(*pwallet);

            std::string strAddress = request.params[0].get_str();
            std::string strMessage = request.params[1].get_str();

            CTxDestination dest = DecodeDestination(strAddress);
            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address");
            }

            const PKHash* pkhash = std::get_if<PKHash>(&dest);
            if (!pkhash) {
                throw JSONRPCError(RPC_TYPE_ERROR, "Address does not refer to key");
            }

            std::string signature;
            SigningResult err = pwallet->SignMessage(strMessage, *pkhash, signature);
            if (err == SigningResult::SIGNING_FAILED) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, SigningResultString(err));
            } else if (err != SigningResult::OK) {
                throw JSONRPCError(RPC_WALLET_ERROR, SigningResultString(err));
            }

            return signature;
        },
    };
}